

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

Type * __thiscall
slang::ast::GenericClassDefSymbol::getDefaultSpecialization(GenericClassDefSymbol *this)

{
  Scope *scope;
  Type *pTVar1;
  LookupLocation lookupLocation;
  ASTContext AStack_48;
  
  if ((this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
      _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged == true) {
    pTVar1 = (this->defaultSpecialization).
             super__Optional_base<const_slang::ast::Type_*,_true,_true>._M_payload.
             super__Optional_payload_base<const_slang::ast::Type_*>._M_payload._M_value;
  }
  else {
    scope = (this->super_Symbol).parentScope;
    if (scope == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/ClassSymbols.cpp"
                 ,0x2e2,
                 "const Type *slang::ast::GenericClassDefSymbol::getDefaultSpecialization() const");
    }
    lookupLocation._12_4_ = 0;
    lookupLocation.scope = (Scope *)SUB128(ZEXT412(0xffffffff) << 0x40,0);
    lookupLocation.index = SUB124(ZEXT412(0xffffffff) << 0x40,8);
    ASTContext::ASTContext(&AStack_48,scope,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x0);
    pTVar1 = getSpecializationImpl
                       (this,&AStack_48,(this->super_Symbol).location,false,
                        (ParameterValueAssignmentSyntax *)0x0);
    (this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_payload._M_value = pTVar1;
    (this->defaultSpecialization).super__Optional_base<const_slang::ast::Type_*,_true,_true>.
    _M_payload.super__Optional_payload_base<const_slang::ast::Type_*>._M_engaged = true;
  }
  return pTVar1;
}

Assistant:

const Type* GenericClassDefSymbol::getDefaultSpecialization() const {
    if (defaultSpecialization)
        return *defaultSpecialization;

    auto scope = getParentScope();
    ASSERT(scope);

    auto result = getSpecializationImpl(ASTContext(*scope, LookupLocation::max), location,
                                        /* forceInvalidParams */ false, nullptr);
    defaultSpecialization = result;
    return result;
}